

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bssrdf.h
# Opt level: O1

Float __thiscall pbrt::TabulatedBSSRDF::PDF_Sp(TabulatedBSSRDF *this,Point3f *pi,Normal3f *ni)

{
  Float r;
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int ch;
  int ch_00;
  int axis;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Float FVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  Float rProj [3];
  float local_64 [3];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  fVar7 = (pi->super_Tuple3<pbrt::Point3,_float>).x - (this->po).super_Tuple3<pbrt::Point3,_float>.x
  ;
  fVar8 = (pi->super_Tuple3<pbrt::Point3,_float>).y - (this->po).super_Tuple3<pbrt::Point3,_float>.y
  ;
  fVar9 = (pi->super_Tuple3<pbrt::Point3,_float>).z - (this->po).super_Tuple3<pbrt::Point3,_float>.z
  ;
  uVar2._0_4_ = (this->ns).super_Tuple3<pbrt::Normal3,_float>.x;
  uVar2._4_4_ = (this->ns).super_Tuple3<pbrt::Normal3,_float>.y;
  local_58._8_8_ = 0;
  local_58._0_8_ = uVar2;
  auVar19._8_4_ = 0x3f800000;
  auVar19._0_8_ = 0x3f8000003f800000;
  auVar19._12_4_ = 0x3f800000;
  fVar4 = (this->ns).super_Tuple3<pbrt::Normal3,_float>.z;
  auVar16 = vmovshdup_avx(local_58);
  auVar15._8_4_ = 0x80000000;
  auVar15._0_8_ = 0x8000000080000000;
  auVar15._12_4_ = 0x80000000;
  auVar15 = vpternlogd_avx512vl(auVar19,ZEXT416((uint)fVar4),auVar15,0xf8);
  fVar20 = auVar15._0_4_;
  fVar21 = -1.0 / (fVar4 + fVar20);
  fVar22 = auVar16._0_4_;
  fVar5 = (float)(undefined4)uVar2 * fVar22 * fVar21;
  auVar19 = vfmadd213ss_fma(ZEXT416((uint)((float)(undefined4)uVar2 *
                                          (float)(undefined4)uVar2 * fVar20)),ZEXT416((uint)fVar21),
                            auVar19);
  fVar6 = (float)(undefined4)uVar2 * -fVar20;
  auVar23 = vfmadd213ss_fma(ZEXT416((uint)(fVar22 * fVar22)),ZEXT416((uint)fVar21),auVar15);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar5 * fVar20 * fVar8)),ZEXT416((uint)fVar7),auVar19);
  auVar10 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar9),ZEXT416((uint)fVar6));
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ * fVar8)),ZEXT416((uint)fVar7),
                            ZEXT416((uint)fVar5));
  auVar12 = vfnmadd231ss_fma(auVar15,ZEXT416((uint)fVar9),auVar16);
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * fVar8)),local_58,ZEXT416((uint)fVar7));
  auVar11 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar4),ZEXT416((uint)fVar9));
  uVar1 = (ni->super_Tuple3<pbrt::Normal3,_float>).x;
  uVar3 = (ni->super_Tuple3<pbrt::Normal3,_float>).y;
  local_38._4_4_ = uVar3;
  local_38._0_4_ = uVar1;
  local_38._8_8_ = 0;
  fVar7 = (ni->super_Tuple3<pbrt::Normal3,_float>).z;
  auVar15 = vmovshdup_avx(local_38);
  fVar21 = auVar12._0_4_ * auVar12._0_4_;
  fVar9 = auVar11._0_4_ * auVar11._0_4_;
  fVar8 = fVar9 + fVar21;
  if (fVar8 < 0.0) {
    local_48 = auVar15;
    local_64[0] = sqrtf(fVar8);
    auVar23 = ZEXT416((uint)auVar23._0_4_);
    auVar15 = local_48;
  }
  else {
    auVar11 = vsqrtss_avx(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8));
    local_64[0] = auVar11._0_4_;
  }
  auVar11 = vfmadd213ss_fma(ZEXT416((uint)(fVar5 * fVar20)),auVar15,ZEXT416((uint)(fVar6 * fVar7)));
  auVar12 = vfmsub213ss_fma(ZEXT416((uint)fVar6),ZEXT416((uint)fVar7),ZEXT416((uint)(fVar6 * fVar7))
                           );
  auVar23 = vfmadd213ss_fma(auVar23,auVar15,ZEXT416((uint)(fVar7 * -fVar22)));
  auVar13 = vfnmsub231ss_fma(ZEXT416((uint)(fVar7 * -fVar22)),ZEXT416((uint)fVar7),auVar16);
  auVar16 = vfmadd213ss_fma(auVar16,auVar15,ZEXT416((uint)(fVar4 * fVar7)));
  auVar15 = vfmsub213ss_fma(ZEXT416((uint)fVar4),ZEXT416((uint)fVar7),ZEXT416((uint)(fVar4 * fVar7))
                           );
  fVar7 = auVar10._0_4_ * auVar10._0_4_;
  fVar9 = fVar9 + fVar7;
  if (fVar9 < 0.0) {
    local_64[1] = sqrtf(fVar9);
  }
  else {
    auVar10 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
    local_64[1] = auVar10._0_4_;
  }
  fVar7 = fVar7 + fVar21;
  if (fVar7 < 0.0) {
    local_64[2] = sqrtf(fVar7);
  }
  else {
    auVar10 = vsqrtss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
    local_64[2] = auVar10._0_4_;
  }
  auVar18 = ZEXT1664(ZEXT816(0) << 0x40);
  auVar19 = vfmadd213ss_fma(ZEXT416(auVar19._0_4_),local_38,
                            ZEXT416((uint)(auVar12._0_4_ + auVar11._0_4_)));
  auVar23 = vfmadd213ss_fma(ZEXT416((uint)fVar5),local_38,
                            ZEXT416((uint)(auVar23._0_4_ + auVar13._0_4_)));
  local_58 = vfmadd213ss_fma(local_58,local_38,ZEXT416((uint)(auVar16._0_4_ + auVar15._0_4_)));
  lVar14 = 0;
  do {
    r = local_64[lVar14];
    ch_00 = 0;
    do {
      FVar17 = PDF_Sr(this,ch_00,r);
      auVar16 = ZEXT416(auVar19._0_4_);
      if (((int)lVar14 != 0) && (auVar16 = ZEXT416(auVar23._0_4_), (int)lVar14 != 1)) {
        auVar16 = local_58;
      }
      auVar10._8_4_ = 0x7fffffff;
      auVar10._0_8_ = 0x7fffffff7fffffff;
      auVar10._12_4_ = 0x7fffffff;
      auVar16 = vandps_avx512vl(auVar16,auVar10);
      auVar16 = vfmadd231ss_fma(ZEXT416(auVar18._0_4_),
                                ZEXT416((uint)(FVar17 * auVar16._0_4_ * 0.25)),
                                ZEXT416((uint)(&DAT_0287a9d4)[lVar14]));
      auVar18 = ZEXT1664(auVar16);
      ch_00 = ch_00 + 1;
    } while (ch_00 != 4);
    lVar14 = lVar14 + 1;
  } while (lVar14 != 3);
  return auVar16._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float PDF_Sp(const Point3f &pi, const Normal3f &ni) const {
        // Express $\pti-\pto$ and $\bold{n}_i$ with respect to local coordinates at
        // $\pto$
        Vector3f d = pi - po;
        Frame f = Frame::FromZ(ns);
        Vector3f dLocal = f.ToLocal(d);
        Normal3f nLocal = f.ToLocal(ni);

        // Compute BSSRDF profile radius under projection along each axis
        Float rProj[3] = {std::sqrt(Sqr(dLocal.y) + Sqr(dLocal.z)),
                          std::sqrt(Sqr(dLocal.z) + Sqr(dLocal.x)),
                          std::sqrt(Sqr(dLocal.x) + Sqr(dLocal.y))};

        // Return combined probability from all BSSRDF sampling strategies
        Float pdf = 0, axisProb[3] = {.25f, .25f, .5f};
        Float chProb = 1 / (Float)NSpectrumSamples;
        for (int axis = 0; axis < 3; ++axis)
            for (int ch = 0; ch < NSpectrumSamples; ++ch)
                pdf += PDF_Sr(ch, rProj[axis]) * std::abs(nLocal[axis]) * chProb *
                       axisProb[axis];
        return pdf;
    }